

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall cmInstallExportGenerator::GenerateScript(cmInstallExportGenerator *this,ostream *os)

{
  string *psVar1;
  cmExportInstallFileGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  const_iterator ci;
  pointer config;
  ostringstream e;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  if ((this->ExportSet->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->ExportSet->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"INSTALL(EXPORT) given unknown export \"",0x26);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(this->ExportSet->Name)._M_dataplus._M_p,
                        (this->ExportSet->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_1b8,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  else {
    ComputeTempDir(this);
    cmsys::SystemTools::MakeDirectory((this->TempDir)._M_dataplus._M_p);
    psVar1 = &this->MainImportFile;
    std::__cxx11::string::_M_assign((string *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->FileName)._M_dataplus._M_p);
    cmExportFileGenerator::SetExportFile
              (&this->EFGen->super_cmExportFileGenerator,(this->MainImportFile)._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)&(this->EFGen->super_cmExportFileGenerator).Namespace)
    ;
    this_00 = this->EFGen;
    (this_00->super_cmExportFileGenerator).ExportOld = this->ExportOld;
    pvVar2 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
    config = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (config == (pvVar2->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName.
          _M_string_length == 0) {
        local_198._0_8_ = local_198 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
        cmExportFileGenerator::AddConfiguration
                  (&this_00->super_cmExportFileGenerator,(string *)local_198);
        if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
          operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
        }
      }
      else {
        cmExportFileGenerator::AddConfiguration
                  (&this_00->super_cmExportFileGenerator,
                   &(this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName);
      }
    }
    else {
      do {
        cmExportFileGenerator::AddConfiguration(&this->EFGen->super_cmExportFileGenerator,config);
        config = config + 1;
      } while (config != (((this->super_cmInstallGenerator).super_cmScriptGenerator.
                          ConfigurationTypes)->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    cmExportFileGenerator::GenerateImportFile(&this->EFGen->super_cmExportFileGenerator);
    cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScript(std::ostream& os)
{
  // Skip empty sets.
  if(ExportSet->GetTargetExports()->empty())
    {
    std::ostringstream e;
    e << "INSTALL(EXPORT) given unknown export \""
      << ExportSet->GetName() << "\"";
    cmSystemTools::Error(e.str().c_str());
    return;
    }

  // Create the temporary directory in which to store the files.
  this->ComputeTempDir();
  cmSystemTools::MakeDirectory(this->TempDir.c_str());

  // Construct a temporary location for the file.
  this->MainImportFile = this->TempDir;
  this->MainImportFile += "/";
  this->MainImportFile += this->FileName;

  // Generate the import file for this export set.
  this->EFGen->SetExportFile(this->MainImportFile.c_str());
  this->EFGen->SetNamespace(this->Namespace);
  this->EFGen->SetExportOld(this->ExportOld);
  if(this->ConfigurationTypes->empty())
    {
    if(!this->ConfigurationName.empty())
      {
      this->EFGen->AddConfiguration(this->ConfigurationName);
      }
    else
      {
      this->EFGen->AddConfiguration("");
      }
    }
  else
    {
    for(std::vector<std::string>::const_iterator
          ci = this->ConfigurationTypes->begin();
        ci != this->ConfigurationTypes->end(); ++ci)
      {
      this->EFGen->AddConfiguration(*ci);
      }
    }
  this->EFGen->GenerateImportFile();

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}